

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBFunctionsInit(ClientContext *context,TableFunctionInitInput *input)

{
  SchemaCatalogEntry *pSVar1;
  pointer prVar2;
  pointer prVar3;
  long lVar4;
  _Head_base<0UL,_duckdb::DuckDBFunctionsData_*,_false> _Var5;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var6;
  type pDVar7;
  pointer pDVar8;
  ulong uVar9;
  pointer *__ptr;
  pointer prVar10;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  __i;
  pointer prVar11;
  _Head_base<0UL,_duckdb::DuckDBFunctionsData_*,_false> local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_50;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  
  local_50._M_head_impl = (GlobalTableFunctionState *)context;
  make_uniq<duckdb::DuckDBFunctionsData>();
  Catalog::GetAllSchemas(&schemas,(ClientContext *)input);
  for (prVar10 = schemas.
                 super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      prVar10 !=
      schemas.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; prVar10 = prVar10 + 1) {
    pSVar1 = prVar10->_M_data;
    pDVar7 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
             ::operator*((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                          *)&local_78);
    local_70._8_8_ = 0;
    local_58 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:98:14)>
               ::_M_invoke;
    local_60 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:98:14)>
               ::_M_manager;
    local_70._M_unused._M_object = pDVar7;
    (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
              (pSVar1,input,0x1a,&local_70);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_70);
    local_70._8_8_ = 0;
    local_58 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:100:14)>
               ::_M_invoke;
    local_60 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:100:14)>
               ::_M_manager;
    local_70._M_unused._M_object = pDVar7;
    (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
              (pSVar1,input,0x19,&local_70);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_70);
    local_70._8_8_ = 0;
    local_58 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:102:14)>
               ::_M_invoke;
    local_60 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:102:14)>
               ::_M_manager;
    local_70._M_unused._M_object = pDVar7;
    (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
              (pSVar1,input,0x1c,&local_70);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_70);
  }
  pDVar8 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                         *)&local_78);
  prVar2 = (pDVar8->entries).
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar8 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                         *)&local_78);
  prVar3 = (pDVar8->entries).
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar2 != prVar3) {
    uVar9 = (long)prVar3 - (long)prVar2 >> 3;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
              (prVar2,prVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)prVar3 - (long)prVar2 < 0x81) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
                (prVar2,prVar3);
    }
    else {
      prVar11 = prVar2 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
                (prVar2,prVar11);
      for (; prVar11 != prVar3; prVar11 = prVar11 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
                  (prVar11);
      }
    }
  }
  _Var6._M_head_impl = local_50._M_head_impl;
  _Var5._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (DuckDBFunctionsData *)0x0;
  (local_50._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)_Var5._M_head_impl;
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                   *)&schemas);
  if (local_78._M_head_impl != (DuckDBFunctionsData *)0x0) {
    (*((local_78._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var6._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBFunctionsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBFunctionsData>();

	// scan all the schemas for tables and collect them and collect them
	auto schemas = Catalog::GetAllSchemas(context);
	for (auto &schema : schemas) {
		ExtractFunctionsFromSchema(context, schema.get(), *result);
	};

	std::sort(result->entries.begin(), result->entries.end(),
	          [&](reference<CatalogEntry> a, reference<CatalogEntry> b) {
		          return (int32_t)a.get().type < (int32_t)b.get().type;
	          });
	return std::move(result);
}